

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularBuffer.cpp
# Opt level: O0

int __thiscall
JetHead::CircularBuffer::waitForData(CircularBuffer *this,int threshold,uint32_t msecs)

{
  int iVar1;
  bool local_85;
  undefined1 local_60 [8];
  AutoLock lock;
  timespec cur;
  timespec start;
  uint32_t timeout;
  uint32_t msecs_local;
  int threshold_local;
  CircularBuffer *this_local;
  
  TimeUtils::getCurTime((timespec *)&cur.tv_nsec);
  AutoLock::AutoLock((AutoLock *)local_60,&this->mLock);
  length_internal(this);
  start.tv_nsec._4_4_ = msecs;
  while( true ) {
    iVar1 = length_internal(this);
    local_85 = false;
    if (iVar1 < threshold) {
      local_85 = Condition::Wait(&this->mDataCondition,&this->mLock,start.tv_nsec._4_4_);
    }
    if (local_85 == false) break;
    TimeUtils::getCurTime((timespec *)&lock.mLine);
    iVar1 = TimeUtils::getDifference((timespec *)&lock.mLine,(timespec *)&cur.tv_nsec);
    start.tv_nsec._4_4_ = msecs - iVar1;
  }
  iVar1 = length_internal(this);
  if (iVar1 < threshold) {
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = length_internal(this);
  }
  AutoLock::~AutoLock((AutoLock *)local_60);
  return this_local._4_4_;
}

Assistant:

int CircularBuffer::waitForData( int threshold, uint32_t msecs )
{
	TRACE_BEGIN( LOG_LVL_NOISE );
	
	uint32_t timeout = msecs;	
	struct timespec start, cur;
	TimeUtils::getCurTime( &start );
	
	LOG_NOISE( "Waiting for data %d cur size %d timeout %d", threshold, length_internal(), msecs );

	AutoLock lock( mLock );
	
	if ( length_internal() < threshold )
		LOG_INFO( "buffer underflow" );
	
	while ( length_internal() < threshold && mDataCondition.Wait( mLock, timeout ) )
	{
		TimeUtils::getCurTime( &cur );
		timeout = msecs - TimeUtils::getDifference( &cur, &start );
		
		LOG_INFO( "Wating for data %d cur size %d msecs remaining %d", threshold, length_internal(), timeout );
	}

	if ( length_internal() >= threshold )
		return length_internal();
	else
		return 0;
}